

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O0

double __thiscall
Kriging::_logLikelihood
          (Kriging *this,vec *_theta,vec *grad_out,mat *hess_out,KModel *model,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *bench)

{
  char *pcVar1;
  double dVar2;
  uword uVar3;
  uword uVar4;
  uword uVar5;
  uword uVar6;
  time_point t0_00;
  time_point t0_01;
  time_point t0_02;
  time_point t0_03;
  time_point t0_04;
  time_point t0_05;
  time_point t0_06;
  time_point t0_07;
  time_point t0_08;
  time_point t0_09;
  time_point t0_10;
  time_point t0_11;
  ulong uVar7;
  uint *puVar8;
  double *pdVar9;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  Cube<double> *in_R9;
  double dVar10;
  result rVar11;
  elem_type eVar12;
  elem_type eVar13;
  double h_lk;
  mat xl;
  mat xk;
  uword j_2;
  uword i_2;
  double dln_k;
  uword j_1;
  uword i_1;
  mat hessR_k_l;
  mat aux;
  mat gradR_l;
  uword l;
  mat H;
  double terme2;
  mat gradR_k;
  uword k;
  uword j;
  uword i;
  vec zeros;
  cube gradR;
  mat x;
  mat Rinv;
  vec terme1;
  time_point t0;
  uword p;
  uword d;
  double ll;
  double sigma2;
  uword n;
  KModel m;
  uword len_1;
  uword col_offset_1;
  uword row_offset_1;
  uword len;
  uword col_offset;
  uword row_offset;
  undefined4 in_stack_ffffffffffffd3f8;
  uword in_stack_ffffffffffffd3fc;
  KModel *in_stack_ffffffffffffd400;
  time_point in_stack_ffffffffffffd408;
  Cube<double> *in_stack_ffffffffffffd410;
  Mat<double> *in_stack_ffffffffffffd418;
  subview_col<double> *in_stack_ffffffffffffd420;
  Col<double> *in_stack_ffffffffffffd428;
  mat *in_stack_ffffffffffffd430;
  mat *in_stack_ffffffffffffd438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd440;
  eOp<arma::eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>,_arma::eop_scalar_plus>
  *in_stack_ffffffffffffd488;
  mat *in_stack_ffffffffffffd4a8;
  string *in_stack_ffffffffffffd4b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_ffffffffffffd4c0;
  undefined4 in_stack_ffffffffffffd4c8;
  uword in_stack_ffffffffffffd4cc;
  Base<double,_arma::Mat<double>_> *in_stack_ffffffffffffd518;
  subview_cube<double> *in_stack_ffffffffffffd520;
  Base<double,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>_> *in_stack_ffffffffffffd5b8;
  subview_cube<double> *in_stack_ffffffffffffd5c0;
  char *in_stack_ffffffffffffd5d8;
  double *in_stack_ffffffffffffd5e0;
  double *in_stack_ffffffffffffd5e8;
  bool local_2839;
  allocator<char> local_27a1;
  string local_27a0 [32];
  duration local_2780;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_2778;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_2760;
  eOp<arma::Mat<double>,_arma::eop_scalar_times> local_2748;
  eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  local_2708;
  Op<arma::Mat<double>,_arma::op_htrans> local_26e8;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>
  local_26a8;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_2690;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  local_2678;
  Op<arma::Mat<double>,_arma::op_htrans> local_2598;
  Op<arma::Mat<double>,_arma::op_htrans2> local_2558;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>
  local_2518;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_2500;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  local_24e8;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  local_2408;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  local_23f8;
  eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>
  local_23e8;
  eOp<arma::eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>,_arma::eop_scalar_plus>
  local_23a8;
  double local_2368;
  rep local_2360;
  allocator<char> local_2351;
  string local_2350 [32];
  duration local_2330;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_2328;
  Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_2310;
  Mat<double> local_22f8;
  rep local_2240;
  allocator<char> local_2231;
  string local_2230 [32];
  duration local_2210;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_2208;
  Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_21f0;
  Mat<double> local_21d8;
  rep local_2128;
  allocator<char> local_2119;
  string local_2118 [32];
  duration local_20f8;
  uint local_20f0;
  uint local_20ec;
  char *local_20e8;
  uint local_20e0;
  uint local_20dc;
  Mat<double> local_20d8;
  rep local_2020;
  allocator<char> local_2011;
  string local_2010 [32];
  duration local_1ff0;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_1fe8;
  Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_1fd0;
  Mat<double> local_1fb8;
  duration local_1f00;
  Mat<double> local_1ef8;
  uint local_1e44;
  rep local_1e40;
  allocator<char> local_1e31;
  string local_1e30 [32];
  duration local_1e10;
  Mat<double> local_1e08;
  duration local_1d58;
  rep local_1d50;
  allocator<char> local_1d41;
  string local_1d40 [32];
  duration local_1d20;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_1d18;
  double local_1d00;
  Op<arma::Mat<double>,_arma::op_htrans> local_1cf8;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times> local_1cb0
  ;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_1c98;
  rep local_1c80;
  allocator<char> local_1c71;
  string local_1c70 [32];
  duration local_1c50;
  Mat<double> local_1c48;
  duration local_1b90;
  uint local_1b84;
  rep local_1b80;
  allocator<char> local_1b71;
  string local_1b70 [32];
  duration local_1b50;
  subview_cube<double> local_1b48;
  subview_cube<double> local_1b18;
  subview_cube<double> local_1ae8;
  undefined1 local_1ab8 [224];
  undefined1 local_19d8 [176];
  eOp<arma::Col<double>,_arma::eop_scalar_times> local_1928;
  uint local_18dc;
  subview_cube<double> local_18d8;
  undefined4 in_stack_ffffffffffffe760;
  undefined4 in_stack_ffffffffffffe764;
  uint uVar14;
  vec *in_stack_ffffffffffffe768;
  Kriging *in_stack_ffffffffffffe770;
  Cube<double> local_17e8;
  rep local_1560;
  allocator<char> local_1551;
  string local_1550 [32];
  duration local_1530;
  Op<arma::Mat<double>,_arma::op_htrans> local_1528 [3];
  Mat<double> local_1438;
  rep local_1380;
  allocator<char> local_1371;
  string local_1370 [32];
  duration local_1350;
  Mat<double> local_1348;
  rep local_1290;
  allocator<char> local_1281;
  string local_1280 [32];
  duration local_1260;
  SizeMat local_10f8;
  SizeMat local_10f0;
  undefined1 local_10e8 [32];
  long local_10c8;
  duration local_1038;
  undefined4 local_1030;
  uint local_102c;
  diagview<double> local_f78;
  eOp<arma::diagview<double>,_arma::eop_log> local_f58;
  diagview<double> local_f18;
  eOp<arma::diagview<double>,_arma::eop_log> local_ef8;
  KModel *local_eb8;
  double local_eb0;
  uint local_ea8;
  int local_e98 [8];
  long local_e78;
  Mat<double> local_de8;
  Mat<double> local_d38 [6];
  double local_918;
  Cube<double> *local_850;
  long local_848;
  int *local_840;
  long local_838;
  long local_830;
  uint local_820;
  uint local_81c;
  int *local_818;
  uint local_810;
  uint local_80c;
  int *local_808;
  uint local_800;
  uint local_7fc;
  Mat<double> *local_7f8;
  uint local_7f0;
  uint local_7ec;
  Mat<double> *local_7e8;
  uint local_7e0;
  uint local_7dc;
  int *local_7d8;
  uint local_7d0;
  uint local_7cc;
  Mat<double> *local_7c8;
  uint local_7c0;
  uint local_7bc;
  Mat<double> *local_7b8;
  uint local_7b0;
  uint local_7ac;
  Mat<double> *local_7a8;
  uint local_7a0;
  uint local_79c;
  Mat<double> *local_798;
  uint local_790;
  uint local_78c;
  Mat<double> *local_788;
  uint local_780;
  uint local_77c;
  int *local_778;
  uint local_770;
  uint local_76c;
  Mat<double> *local_768;
  uint local_760;
  uint local_75c;
  Mat<double> *local_758;
  uint local_750;
  uint local_74c;
  int *local_748;
  diagview<double> *local_740;
  eOp<arma::diagview<double>,_arma::eop_log> *local_738;
  diagview<double> *local_730;
  eOp<arma::diagview<double>,_arma::eop_log> *local_728;
  uint local_720;
  uint local_71c;
  uint local_718;
  uword local_714;
  uword local_710;
  undefined4 local_70c;
  Mat<double> *local_708;
  diagview<double> *local_700;
  uint local_6f8;
  uint local_6f4;
  uint local_6f0;
  uword local_6ec;
  uword local_6e8;
  undefined4 local_6e4;
  Mat<double> *local_6e0;
  diagview<double> *local_6d8;
  Mat<double> *local_6d0;
  Mat<double> *local_6c8;
  Op<arma::Mat<double>,_arma::op_htrans> *local_6c0;
  Mat<double> *local_6b8;
  Op<arma::Mat<double>,_arma::op_htrans> *local_6b0;
  Mat<double> *local_6a8;
  Op<arma::Mat<double>,_arma::op_htrans> *local_6a0;
  Mat<double> *local_698;
  Op<arma::Mat<double>,_arma::op_htrans> *local_690;
  uint local_688;
  uint local_684;
  Cube<double> *local_680;
  subview_cube<double> *local_678;
  uint local_670;
  uint local_66c;
  Cube<double> *local_668;
  subview_cube<double> *local_660;
  uint local_658;
  uint local_654;
  Cube<double> *local_650;
  subview_cube<double> *local_648;
  uint local_640;
  uint local_63c;
  Cube<double> *local_638;
  subview_cube<double> *local_630;
  undefined1 *local_628;
  double local_620;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_618;
  int local_60c;
  long local_608;
  undefined1 *local_600;
  Mat<double> *local_5f8;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times> *local_5f0
  ;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_5e8;
  Mat<double> *local_5e0;
  Op<arma::Mat<double>,_arma::op_htrans> *local_5d8;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times> *local_5d0
  ;
  uint local_5c4;
  undefined1 *local_5c0;
  uint local_5b4;
  undefined1 *local_5b0;
  uint local_5a4;
  long local_5a0;
  uint local_594;
  undefined1 *local_590;
  uint local_584;
  undefined1 *local_580;
  Mat<double> *local_578;
  Mat<double> *local_570;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_568;
  Mat<double> *local_560;
  Mat<double> *local_558;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_550;
  Mat<double> *local_548;
  Mat<double> *local_540;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_538;
  Mat<double> *local_530;
  Mat<double> *local_528;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_520;
  Mat<double> *local_518;
  Mat<double> *local_510;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_508;
  Mat<double> *local_500;
  Mat<double> *local_4f8;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_4f0;
  Mat<double> *local_4e8;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_4e0;
  Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_4d8;
  Mat<double> *local_4d0;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_4c8;
  Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_4c0;
  Mat<double> *local_4b8;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_4b0;
  Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_4a8;
  uint local_49c;
  long local_498;
  result local_490;
  eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>
  *local_488;
  eOp<arma::eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>,_arma::eop_scalar_plus>
  *local_480;
  string *local_478;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_470;
  eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>
  *local_468;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_460;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_458;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_450;
  double local_448;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_440;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_438;
  Mat<double> *local_430;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>
  *local_428;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_420;
  Mat<double> *local_418;
  Op<arma::Mat<double>,_arma::op_htrans2> *local_410;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>
  *local_408;
  Op<arma::Mat<double>,_arma::op_htrans> *local_400;
  undefined8 local_3f8;
  Op<arma::Mat<double>,_arma::op_htrans2> *local_3f0;
  double local_3e8;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_3e0;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_3d8;
  Mat<double> *local_3d0;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>
  *local_3c8;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_3c0;
  eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_3b8;
  Op<arma::Mat<double>,_arma::op_htrans> *local_3b0;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>
  *local_3a8;
  eOp<arma::Mat<double>,_arma::eop_scalar_times> *local_3a0;
  Mat<double> *local_398;
  eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_390;
  Mat<double> *local_388;
  undefined8 local_380;
  eOp<arma::Mat<double>,_arma::eop_scalar_times> *local_378;
  undefined4 local_36c;
  eOp<arma::eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>,_arma::eop_scalar_plus>
  *local_368;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_360;
  eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_350;
  uint local_33c;
  uword local_338;
  uword local_334;
  Mat<double> *local_330;
  diagview<double> *local_328;
  uint local_31c;
  uword local_318;
  uword local_314;
  Mat<double> *local_310;
  diagview<double> *local_308;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  uint local_2f0;
  uint local_2ec;
  Cube<double> *local_2e8;
  subview_cube<double> *local_2e0;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  uint local_2c8;
  uint local_2c4;
  Cube<double> *local_2c0;
  subview_cube<double> *local_2b8;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  uint local_2a0;
  uint local_29c;
  Cube<double> *local_298;
  subview_cube<double> *local_290;
  undefined4 local_284;
  undefined4 local_280;
  undefined4 local_27c;
  uint local_278;
  uint local_274;
  Cube<double> *local_270;
  subview_cube<double> *local_268;
  eOp<arma::Mat<double>,_arma::eop_scalar_times> *local_260;
  Mat<double> *local_258;
  eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_250;
  eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_248;
  eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_240;
  string local_228 [32];
  char *local_208;
  uword local_200;
  uword local_1fc;
  uword local_1f8;
  uword local_1f4;
  Proxy<arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>_> *local_1f0;
  Proxy<arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>_> *local_1d8;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_1c0;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_1b8;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_1b0;
  string local_198 [32];
  char *local_178;
  uword local_170;
  uword local_16c;
  uword local_168;
  uword local_164;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_160;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_158;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_150;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_148;
  double local_f8;
  undefined4 local_ec;
  eOp<arma::eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>,_arma::eop_scalar_plus>
  *local_e8;
  undefined4 local_dc;
  double local_d0;
  double local_c8;
  undefined4 local_bc;
  undefined4 local_ac;
  eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>
  *local_a8;
  undefined4 local_9c;
  eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>
  *local_98;
  undefined4 local_8c;
  Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
  *local_88;
  undefined4 local_7c;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_78;
  double local_70;
  mat *local_68;
  undefined4 local_5c;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_58;
  undefined4 local_4c;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_48;
  undefined4 local_3c;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_38;
  double local_30;
  double local_28;
  undefined4 local_1c;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_18;
  undefined4 local_c;
  eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
  *local_8;
  
  local_850 = in_R9;
  local_848 = in_R8;
  local_840 = in_RCX;
  local_838 = in_RDX;
  local_830 = in_RSI;
  make_Model(in_stack_ffffffffffffe770,in_stack_ffffffffffffe768,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
  if (local_848 != 0) {
    KModel::operator=(in_stack_ffffffffffffd400,
                      (KModel *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
  }
  local_ea8 = *(uint *)(in_RDI + 0x20);
  if ((*(byte *)(in_RDI + 0xaf0) & 1) == 0) {
    local_eb0 = *(double *)(in_RDI + 0xae8);
    uVar7 = (ulong)local_ea8;
    dVar10 = log(local_eb0 * 6.283185307179586);
    local_700 = &local_f78;
    local_70c = 0;
    local_710 = 0;
    local_714 = 0;
    local_708 = &local_de8;
    arma::arma_check_bounds<char[46]>
              (SUB81((ulong)in_stack_ffffffffffffd400 >> 0x38,0),
               (char (*) [46])CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
    local_71c = local_de8.n_rows - local_710;
    local_720 = local_de8.n_cols - local_714;
    puVar8 = std::min<unsigned_int>(&local_71c,&local_720);
    local_718 = *puVar8;
    local_308 = &local_f78;
    local_314 = local_710;
    local_318 = local_714;
    local_f78.row_offset = local_710;
    local_f78.col_offset = local_714;
    local_738 = &local_f58;
    local_740 = &local_f78;
    local_31c = local_718;
    local_310 = &local_de8;
    local_f78.m = &local_de8;
    local_f78.n_rows = local_718;
    local_f78.n_elem = local_718;
    arma::eOp<arma::diagview<double>,_arma::eop_log>::eOp
              ((eOp<arma::diagview<double>,_arma::eop_log> *)in_stack_ffffffffffffd400,
               (diagview<double> *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
    rVar11 = arma::sum<arma::eOp<arma::diagview<double>,arma::eop_log>>
                       ((eOp<arma::diagview<double>,_arma::eop_log> *)0x18b8a4);
    LinearAlgebra::crossprod((mat *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8));
    eVar12 = arma::as_scalar<arma::Mat<double>>
                       ((Base<double,_arma::Mat<double>_> *)in_stack_ffffffffffffd440);
    local_eb8 = (KModel *)(((double)uVar7 * dVar10 + rVar11 + rVar11 + eVar12 / local_eb0) * -0.5);
    arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
    arma::eOp<arma::diagview<double>,_arma::eop_log>::~eOp(&local_f58);
    arma::diagview<double>::~diagview(&local_f78);
  }
  else {
    local_eb0 = local_918 / (double)local_ea8;
    uVar7 = (ulong)local_ea8;
    dVar10 = log(local_eb0 * 6.283185307179586);
    local_6d8 = &local_f18;
    local_6e4 = 0;
    local_6e8 = 0;
    local_6ec = 0;
    local_6e0 = &local_de8;
    arma::arma_check_bounds<char[46]>
              (SUB81((ulong)in_stack_ffffffffffffd400 >> 0x38,0),
               (char (*) [46])CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
    local_6f4 = local_de8.n_rows - local_6e8;
    local_6f8 = local_de8.n_cols - local_6ec;
    puVar8 = std::min<unsigned_int>(&local_6f4,&local_6f8);
    local_6f0 = *puVar8;
    local_328 = &local_f18;
    local_334 = local_6e8;
    local_338 = local_6ec;
    local_f18.row_offset = local_6e8;
    local_f18.col_offset = local_6ec;
    local_728 = &local_ef8;
    local_730 = &local_f18;
    local_33c = local_6f0;
    local_330 = &local_de8;
    local_f18.m = &local_de8;
    local_f18.n_rows = local_6f0;
    local_f18.n_elem = local_6f0;
    arma::eOp<arma::diagview<double>,_arma::eop_log>::eOp
              ((eOp<arma::diagview<double>,_arma::eop_log> *)in_stack_ffffffffffffd400,
               (diagview<double> *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
    rVar11 = arma::sum<arma::eOp<arma::diagview<double>,arma::eop_log>>
                       ((eOp<arma::diagview<double>,_arma::eop_log> *)0x18b567);
    local_eb8 = (KModel *)(((double)uVar7 * dVar10 + rVar11 + rVar11 + (double)local_ea8) * -0.5);
    arma::eOp<arma::diagview<double>,_arma::eop_log>::~eOp(&local_ef8);
    arma::diagview<double>::~diagview(&local_f18);
  }
  if (local_838 != 0) {
    local_102c = *(uint *)(in_RDI + 0x24);
    local_1030 = *(undefined4 *)(in_RDI + 0x4a4);
    local_1038.__r = (rep)Bench::tic();
    arma::Col<double>::Col
              ((Col<double> *)in_stack_ffffffffffffd418,
               (uword)((ulong)in_stack_ffffffffffffd410 >> 0x20));
    local_6d0 = local_d38;
    local_2839 = true;
    if (local_d38[0].mem != (double *)0x0) {
      local_10f0 = arma::size<double>((Mat<double> *)
                                      CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8))
      ;
      local_10f8 = arma::size<double>((Mat<double> *)
                                      CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8))
      ;
      local_2839 = arma::SizeMat::operator!=(&local_10f0,&local_10f8);
    }
    if (local_2839 != false) {
      arma::Mat<double>::Mat<arma::fill::fill_eye>
                ((Mat<double> *)in_stack_ffffffffffffd410,
                 (uword)((ulong)in_stack_ffffffffffffd408.__d.__r >> 0x20),
                 SUB84(in_stack_ffffffffffffd408.__d.__r,0),
                 (fill_class<arma::fill::fill_eye> *)in_stack_ffffffffffffd400);
      LinearAlgebra::solve(in_stack_ffffffffffffd438,in_stack_ffffffffffffd430);
      arma::Mat<double>::operator=
                (&in_stack_ffffffffffffd400->R,
                 (Mat<double> *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
      arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
      arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                 (allocator<char> *)in_stack_ffffffffffffd430);
      local_1290 = local_1038.__r;
      t0_00.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
      t0_00.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
      local_1260.__r = (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_00);
      local_1038.__r = local_1260.__r;
      std::__cxx11::string::~string(local_1280);
      std::allocator<char>::~allocator(&local_1281);
    }
    LinearAlgebra::crossprod((mat *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
               (allocator<char> *)in_stack_ffffffffffffd430);
    local_1380 = local_1038.__r;
    t0_01.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
    t0_01.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
    local_1350.__r = (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_01);
    local_1038.__r = local_1350.__r;
    std::__cxx11::string::~string(local_1370);
    std::allocator<char>::~allocator(&local_1371);
    local_698 = &local_de8;
    local_690 = local_1528;
    arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(local_1528,local_698);
    arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
              (&in_stack_ffffffffffffd400->R,
               (Op<arma::Mat<double>,_arma::op_htrans> *)
               CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
    LinearAlgebra::solve(in_stack_ffffffffffffd438,in_stack_ffffffffffffd430);
    arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
    arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(local_1528);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
               (allocator<char> *)in_stack_ffffffffffffd430);
    local_1560 = local_1038.__r;
    t0_02.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
    t0_02.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
    local_1530.__r = (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_02);
    local_1038.__r = local_1530.__r;
    std::__cxx11::string::~string(local_1550);
    std::allocator<char>::~allocator(&local_1551);
    arma::Cube<double>::Cube<arma::fill::fill_none>
              (in_stack_ffffffffffffd410,(uword)((ulong)in_stack_ffffffffffffd408.__d.__r >> 0x20),
               SUB84(in_stack_ffffffffffffd408.__d.__r,0),
               (uword)((ulong)in_stack_ffffffffffffd400 >> 0x20),
               (fill_class<arma::fill::fill_none> *)
               CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
    arma::Col<double>::Col<arma::fill::fill_zeros>
              ((Col<double> *)in_stack_ffffffffffffd420,
               (uword)((ulong)in_stack_ffffffffffffd418 >> 0x20),
               (fill_class<arma::fill::fill_zeros> *)in_stack_ffffffffffffd410);
    for (uVar14 = 0; uVar14 < local_ea8; uVar14 = uVar14 + 1) {
      local_630 = &local_18d8;
      local_640 = uVar14;
      local_63c = uVar14;
      local_638 = &local_17e8;
      arma::arma_check_bounds<char[36]>
                (SUB81((ulong)in_stack_ffffffffffffd400 >> 0x38,0),
                 (char (*) [36])CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
      local_2e0 = &local_18d8;
      local_2ec = local_63c;
      local_2f0 = local_640;
      local_2f4 = 0;
      local_2f8 = 1;
      local_2fc = 1;
      local_18d8.aux_row1 = local_63c;
      local_18d8.aux_col1 = local_640;
      local_18d8.aux_slice1 = 0;
      local_18d8.n_rows = 1;
      local_18d8.n_cols = 1;
      local_18d8.n_elem_slice = 1;
      local_18d8.n_slices = local_17e8.n_slices;
      local_2e8 = &local_17e8;
      local_18d8.m = &local_17e8;
      arma::subview_cube<double>::operator=(in_stack_ffffffffffffd520,in_stack_ffffffffffffd518);
      arma::subview_cube<double>::~subview_cube(&local_18d8);
      for (local_18dc = 0; local_18dc < uVar14; local_18dc = local_18dc + 1) {
        local_748 = local_e98;
        local_750 = local_18dc;
        local_74c = uVar14;
        pdVar9 = arma::access::rw<double>
                           ((double *)(local_e78 + (ulong)(uVar14 + local_18dc * local_e98[0]) * 8))
        ;
        dVar10 = *pdVar9;
        local_608 = in_RDI + 0x340;
        local_60c = uVar14 * local_ea8 + local_18dc;
        local_600 = local_1ab8;
        arma::arma_check_bounds<char[32]>
                  (SUB81((ulong)in_stack_ffffffffffffd400 >> 0x38,0),
                   (char (*) [32])CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
        arma::subview_col<double>::subview_col
                  (in_stack_ffffffffffffd420,in_stack_ffffffffffffd418,
                   (uword)((ulong)in_stack_ffffffffffffd410 >> 0x20));
        arma::Col<double>::Col<arma::subview<double>>
                  (in_stack_ffffffffffffd428,
                   (Base<double,_arma::subview<double>_> *)in_stack_ffffffffffffd420);
        std::function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>::
        operator()((function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>
                    *)in_stack_ffffffffffffd418,(Col<double> *)in_stack_ffffffffffffd410,
                   (Col<double> *)in_stack_ffffffffffffd408.__d.__r);
        local_618 = &local_1928;
        local_628 = local_19d8;
        local_620 = dVar10;
        arma::eOp<arma::Col<double>,_arma::eop_scalar_times>::eOp
                  ((eOp<arma::Col<double>,_arma::eop_scalar_times> *)in_stack_ffffffffffffd410,
                   (Col<double> *)in_stack_ffffffffffffd408.__d.__r,
                   (elem_type)in_stack_ffffffffffffd400);
        local_648 = &local_1ae8;
        local_658 = local_18dc;
        local_654 = uVar14;
        local_650 = &local_17e8;
        arma::arma_check_bounds<char[36]>
                  (SUB81((ulong)in_stack_ffffffffffffd400 >> 0x38,0),
                   (char (*) [36])CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
        local_2b8 = &local_1ae8;
        local_2c4 = local_654;
        local_2c8 = local_658;
        local_2cc = 0;
        local_2d0 = 1;
        local_2d4 = 1;
        local_1ae8.aux_row1 = local_654;
        local_1ae8.aux_col1 = local_658;
        local_1ae8.aux_slice1 = 0;
        local_1ae8.n_rows = 1;
        local_1ae8.n_cols = 1;
        local_1ae8.n_elem_slice = 1;
        local_1ae8.n_slices = local_17e8.n_slices;
        local_2c0 = &local_17e8;
        local_1ae8.m = &local_17e8;
        arma::subview_cube<double>::operator=(in_stack_ffffffffffffd5c0,in_stack_ffffffffffffd5b8);
        arma::subview_cube<double>::~subview_cube(&local_1ae8);
        arma::eOp<arma::Col<double>,_arma::eop_scalar_times>::~eOp(&local_1928);
        arma::Col<double>::~Col((Col<double> *)0x18c466);
        arma::Col<double>::~Col((Col<double> *)0x18c473);
        arma::subview_col<double>::~subview_col((subview_col<double> *)0x18c480);
        local_660 = &local_1b18;
        local_670 = local_18dc;
        local_66c = uVar14;
        local_668 = &local_17e8;
        arma::arma_check_bounds<char[36]>
                  (SUB81((ulong)in_stack_ffffffffffffd400 >> 0x38,0),
                   (char (*) [36])CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
        local_290 = &local_1b18;
        local_29c = local_66c;
        local_2a0 = local_670;
        local_2a4 = 0;
        local_2a8 = 1;
        local_2ac = 1;
        local_1b18.aux_row1 = local_66c;
        local_1b18.aux_col1 = local_670;
        local_1b18.aux_slice1 = 0;
        local_1b18.n_rows = 1;
        local_1b18.n_cols = 1;
        local_1b18.n_elem_slice = 1;
        local_1b18.n_slices = local_17e8.n_slices;
        local_678 = &local_1b48;
        local_684 = local_18dc;
        local_688 = uVar14;
        local_680 = &local_17e8;
        local_298 = &local_17e8;
        local_1b18.m = &local_17e8;
        arma::arma_check_bounds<char[36]>
                  (SUB81((ulong)in_stack_ffffffffffffd400 >> 0x38,0),
                   (char (*) [36])CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
        local_268 = &local_1b48;
        local_274 = local_684;
        local_278 = local_688;
        local_27c = 0;
        local_280 = 1;
        local_284 = 1;
        local_1b48.aux_row1 = local_684;
        local_1b48.aux_col1 = local_688;
        local_1b48.aux_slice1 = 0;
        local_1b48.n_rows = 1;
        local_1b48.n_cols = 1;
        local_1b48.n_elem_slice = 1;
        local_1b48.n_slices = local_17e8.n_slices;
        local_270 = &local_17e8;
        local_1b48.m = &local_17e8;
        arma::subview_cube<double>::operator=
                  ((subview_cube<double> *)in_stack_ffffffffffffd400,
                   (subview_cube<double> *)
                   CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
        arma::subview_cube<double>::~subview_cube(&local_1b48);
        arma::subview_cube<double>::~subview_cube(&local_1b18);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
               (allocator<char> *)in_stack_ffffffffffffd430);
    local_1b80 = local_1038.__r;
    t0_03.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
    t0_03.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
    local_1b50.__r = (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_03);
    local_1038.__r = local_1b50.__r;
    std::__cxx11::string::~string(local_1b70);
    std::allocator<char>::~allocator(&local_1b71);
    for (local_1b84 = 0; local_1b84 < local_102c; local_1b84 = local_1b84 + 1) {
      local_1b90.__r = (rep)Bench::tic();
      local_1038.__r = local_1b90.__r;
      arma::Cube<double>::slice((Cube<double> *)in_stack_ffffffffffffd400,in_stack_ffffffffffffd3fc)
      ;
      arma::Mat<double>::Mat
                (&in_stack_ffffffffffffd400->R,
                 (Mat<double> *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                 (allocator<char> *)in_stack_ffffffffffffd430);
      local_1c80 = local_1038.__r;
      t0_04.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
      t0_04.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
      local_1c50.__r = (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_04);
      local_1038.__r = local_1c50.__r;
      std::__cxx11::string::~string(local_1c70);
      std::allocator<char>::~allocator(&local_1c71);
      local_6a0 = &local_1cf8;
      local_6a8 = &local_1438;
      arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(&local_1cf8,local_6a8);
      local_5d0 = &local_1cb0;
      local_5d8 = &local_1cf8;
      local_5e0 = &local_1c48;
      arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>
      ::Glue(&local_1cb0,local_5d8,local_5e0);
      local_5e8 = &local_1c98;
      local_5f0 = &local_1cb0;
      local_5f8 = &local_1438;
      arma::
      Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
      ::Glue(&local_1c98,local_5f0,local_5f8);
      eVar13 = arma::
               as_scalar<arma::Glue<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Mat<double>,arma::glue_times>,arma::Mat<double>>
                         ((Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                           *)in_stack_ffffffffffffd400,
                          (result *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
      dVar10 = eVar13 / local_eb0;
      local_580 = local_10e8;
      local_584 = local_1b84;
      pdVar9 = arma::access::rw<double>((double *)(local_10c8 + (ulong)local_1b84 * 8));
      *pdVar9 = dVar10;
      arma::
      Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
      ::~Glue(&local_1c98);
      arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>
      ::~Glue(&local_1cb0);
      arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(&local_1cf8);
      local_4f0 = &local_1d18;
      local_4f8 = &local_1348;
      local_500 = &local_1c48;
      arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::Glue
                (&local_1d18,local_4f8,local_500);
      rVar11 = arma::trace<arma::Mat<double>,arma::Mat<double>>
                         ((Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)
                          in_stack_ffffffffffffd488);
      arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::~Glue(&local_1d18);
      local_590 = local_10e8;
      local_594 = local_1b84;
      local_1d00 = -rVar11;
      pdVar9 = arma::access::rw<double>((double *)(local_10c8 + (ulong)local_1b84 * 8));
      dVar10 = *pdVar9 + local_1d00;
      local_5a0 = local_838;
      local_5a4 = local_1b84;
      pdVar9 = arma::access::rw<double>
                         ((double *)(*(long *)(local_838 + 0x20) + (ulong)local_1b84 * 8));
      *pdVar9 = dVar10 / 2.0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                 (allocator<char> *)in_stack_ffffffffffffd430);
      local_1d50 = local_1038.__r;
      t0_05.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
      t0_05.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
      local_1d20.__r = (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_05);
      local_1038.__r = local_1d20.__r;
      std::__cxx11::string::~string(local_1d40);
      std::allocator<char>::~allocator(&local_1d41);
      if (local_840 != (int *)0x0) {
        local_1d58.__r = (rep)Bench::tic();
        local_1038.__r = local_1d58.__r;
        LinearAlgebra::tcrossprod(in_stack_ffffffffffffd4a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                   (allocator<char> *)in_stack_ffffffffffffd430);
        local_1e40 = local_1038.__r;
        t0_06.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
        t0_06.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
        local_1e10.__r = (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_06);
        local_1038.__r = local_1e10.__r;
        std::__cxx11::string::~string(local_1e30);
        std::allocator<char>::~allocator(&local_1e31);
        for (local_1e44 = 0; local_1e44 <= local_1b84; local_1e44 = local_1e44 + 1) {
          arma::Cube<double>::slice
                    ((Cube<double> *)in_stack_ffffffffffffd400,in_stack_ffffffffffffd3fc);
          arma::Mat<double>::Mat
                    (&in_stack_ffffffffffffd400->R,
                     (Mat<double> *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
          local_1f00.__r = (rep)Bench::tic();
          local_508 = &local_1fe8;
          local_510 = &local_1c48;
          local_518 = &local_1348;
          local_1038.__r = local_1f00.__r;
          arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::Glue
                    (&local_1fe8,local_510,local_518);
          local_4a8 = &local_1fd0;
          local_4b0 = &local_1fe8;
          local_4b8 = &local_1ef8;
          arma::
          Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
          ::Glue(&local_1fd0,local_4b0,local_4b8);
          arma::Mat<double>::
          Mat<arma::Glue<arma::Mat<double>,arma::Mat<double>,arma::glue_times>,arma::Mat<double>,arma::glue_times>
                    (&in_stack_ffffffffffffd400->R,
                     (Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                      *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
          arma::
          Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
          ::~Glue(&local_1fd0);
          arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::~Glue(&local_1fe8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                     (allocator<char> *)in_stack_ffffffffffffd430);
          local_2020 = local_1038.__r;
          t0_07.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
          t0_07.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
          local_1ff0.__r =
               (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_07);
          local_1038.__r = local_1ff0.__r;
          std::__cxx11::string::~string(local_2010);
          std::allocator<char>::~allocator(&local_2011);
          arma::Mat<double>::Mat<arma::fill::fill_none>
                    ((Mat<double> *)in_stack_ffffffffffffd410,
                     (uword)((ulong)in_stack_ffffffffffffd408.__d.__r >> 0x20),
                     SUB84(in_stack_ffffffffffffd408.__d.__r,0),
                     (fill_class<arma::fill::fill_none> *)in_stack_ffffffffffffd400);
          if (local_1b84 == local_1e44) {
            for (local_20dc = 0; local_20dc < local_ea8; local_20dc = local_20dc + 1) {
              local_758 = &local_20d8;
              local_75c = local_20dc;
              local_760 = local_20dc;
              pdVar9 = arma::access::rw<double>
                                 (local_20d8.mem + (local_20dc + local_20dc * local_20d8.n_rows));
              *pdVar9 = 0.0;
              for (local_20e0 = 0; local_20e0 < local_20dc; local_20e0 = local_20e0 + 1) {
                local_768 = &local_1c48;
                local_76c = local_20dc;
                local_770 = local_20e0;
                in_stack_ffffffffffffd5e8 =
                     arma::access::rw<double>
                               (local_1c48.mem + (local_20dc + local_20e0 * local_1c48.n_rows));
                pcVar1 = (char *)*in_stack_ffffffffffffd5e8;
                local_778 = local_e98;
                local_77c = local_20dc;
                local_780 = local_20e0;
                in_stack_ffffffffffffd5d8 = pcVar1;
                local_20e8 = pcVar1;
                in_stack_ffffffffffffd5e0 =
                     arma::access::rw<double>
                               ((double *)
                                (local_e78 + (ulong)(local_20dc + local_20e0 * local_e98[0]) * 8));
                local_498 = local_830;
                local_49c = local_1b84;
                dVar10 = (double)pcVar1 *
                         ((double)in_stack_ffffffffffffd5d8 / *in_stack_ffffffffffffd5e0 -
                         (*(double *)(in_RDI + 0x1930) + 1.0) /
                         *(double *)(*(long *)(local_830 + 0x20) + (ulong)local_1b84 * 8));
                local_788 = &local_20d8;
                local_78c = local_20e0;
                local_790 = local_20dc;
                pdVar9 = arma::access::rw<double>
                                   (local_20d8.mem + (local_20e0 + local_20dc * local_20d8.n_rows));
                *pdVar9 = dVar10;
                local_798 = &local_20d8;
                local_79c = local_20dc;
                local_7a0 = local_20e0;
                pdVar9 = arma::access::rw<double>
                                   (local_20d8.mem + (local_20dc + local_20e0 * local_20d8.n_rows));
                *pdVar9 = dVar10;
              }
            }
          }
          else {
            for (local_20ec = 0; local_20ec < local_ea8; local_20ec = local_20ec + 1) {
              local_7a8 = &local_20d8;
              local_7ac = local_20ec;
              local_7b0 = local_20ec;
              pdVar9 = arma::access::rw<double>
                                 (local_20d8.mem + (local_20ec + local_20ec * local_20d8.n_rows));
              *pdVar9 = 0.0;
              for (local_20f0 = 0; local_20f0 < local_20ec; local_20f0 = local_20f0 + 1) {
                local_7b8 = &local_1c48;
                local_7bc = local_20ec;
                local_7c0 = local_20f0;
                pdVar9 = arma::access::rw<double>
                                   (local_1c48.mem + (local_20ec + local_20f0 * local_1c48.n_rows));
                dVar10 = *pdVar9;
                local_7c8 = &local_1ef8;
                local_7cc = local_20ec;
                local_7d0 = local_20f0;
                pdVar9 = arma::access::rw<double>
                                   (local_1ef8.mem + (local_20ec + local_20f0 * local_1ef8.n_rows));
                dVar2 = *pdVar9;
                local_7d8 = local_e98;
                local_7dc = local_20ec;
                local_7e0 = local_20f0;
                pdVar9 = arma::access::rw<double>
                                   ((double *)
                                    (local_e78 + (ulong)(local_20ec + local_20f0 * local_e98[0]) * 8
                                    ));
                dVar10 = (dVar10 * dVar2) / *pdVar9;
                local_7e8 = &local_20d8;
                local_7ec = local_20f0;
                local_7f0 = local_20ec;
                pdVar9 = arma::access::rw<double>
                                   (local_20d8.mem + (local_20f0 + local_20ec * local_20d8.n_rows));
                *pdVar9 = dVar10;
                local_7f8 = &local_20d8;
                local_7fc = local_20ec;
                local_800 = local_20f0;
                pdVar9 = arma::access::rw<double>
                                   (local_20d8.mem + (local_20ec + local_20f0 * local_20d8.n_rows));
                *pdVar9 = dVar10;
              }
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                     (allocator<char> *)in_stack_ffffffffffffd430);
          local_2128 = local_1038.__r;
          t0_08.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
          t0_08.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
          local_20f8.__r =
               (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_08);
          local_1038.__r = local_20f8.__r;
          std::__cxx11::string::~string(local_2118);
          std::allocator<char>::~allocator(&local_2119);
          local_528 = local_d38;
          local_520 = &local_2208;
          local_530 = &local_1c48;
          arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::Glue
                    (&local_2208,local_528,local_530);
          local_4c0 = &local_21f0;
          local_4c8 = &local_2208;
          local_4d0 = &local_1438;
          arma::
          Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
          ::Glue(&local_21f0,local_4c8,local_4d0);
          arma::Mat<double>::
          Mat<arma::Glue<arma::Mat<double>,arma::Mat<double>,arma::glue_times>,arma::Mat<double>,arma::glue_times>
                    (&in_stack_ffffffffffffd400->R,
                     (Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                      *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
          arma::
          Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
          ::~Glue(&local_21f0);
          arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::~Glue(&local_2208);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                     (allocator<char> *)in_stack_ffffffffffffd430);
          local_2240 = local_1038.__r;
          t0_09.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
          t0_09.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
          local_2210.__r =
               (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_09);
          local_1038.__r = local_2210.__r;
          std::__cxx11::string::~string(local_2230);
          std::allocator<char>::~allocator(&local_2231);
          arma::Mat<double>::Mat(&local_22f8);
          if (local_1b84 == local_1e44) {
            arma::Mat<double>::operator=
                      (&in_stack_ffffffffffffd400->R,
                       (Mat<double> *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8))
            ;
          }
          else {
            local_540 = local_d38;
            local_538 = &local_2328;
            local_548 = &local_1ef8;
            arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::Glue
                      (&local_2328,local_540,local_548);
            local_4d8 = &local_2310;
            local_4e0 = &local_2328;
            local_4e8 = &local_1438;
            arma::
            Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
            ::Glue(&local_2310,local_4e0,local_4e8);
            arma::Mat<double>::operator=
                      (&in_stack_ffffffffffffd400->R,
                       (Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                        *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
            arma::
            Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
            ::~Glue(&local_2310);
            arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::~Glue(&local_2328);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                     (allocator<char> *)in_stack_ffffffffffffd430);
          local_2360 = local_1038.__r;
          t0_10.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
          t0_10.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
          local_2330.__r =
               (rep)Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_10);
          local_1038.__r = local_2330.__r;
          std::__cxx11::string::~string(local_2350);
          std::allocator<char>::~allocator(&local_2351);
          local_6b0 = &local_2598;
          local_6b8 = &local_21d8;
          arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(&local_2598,local_6b8);
          local_3f0 = &local_2558;
          local_3f8 = 0x4000000000000000;
          local_400 = &local_2598;
          arma::Op<arma::Mat<double>,_arma::op_htrans2>::Op(&local_2558,local_2598.m,2.0);
          local_408 = &local_2518;
          local_410 = &local_2558;
          local_418 = &local_1e08;
          arma::
          Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>::
          Glue(&local_2518,local_410,local_418);
          local_420 = &local_2500;
          local_428 = &local_2518;
          local_430 = &local_22f8;
          arma::
          Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
          ::Glue(&local_2500,local_428,local_430);
          local_438 = &local_24e8;
          local_440 = &local_2500;
          local_448 = local_eb0;
          arma::
          eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
          ::eOp((eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
                 *)in_stack_ffffffffffffd410,
                (Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                 *)in_stack_ffffffffffffd408.__d.__r,(elem_type)in_stack_ffffffffffffd400);
          local_6c0 = &local_26e8;
          local_6c8 = &local_1438;
          arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(&local_26e8,local_6c8);
          local_378 = &local_2748;
          local_380 = 0x4000000000000000;
          local_388 = &local_1fb8;
          arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>::eOp
                    ((eOp<arma::Mat<double>,_arma::eop_scalar_times> *)in_stack_ffffffffffffd410,
                     (Mat<double> *)in_stack_ffffffffffffd408.__d.__r,
                     (elem_type)in_stack_ffffffffffffd400);
          local_390 = &local_2708;
          local_398 = &local_20d8;
          local_3a0 = &local_2748;
          local_260 = local_3a0;
          local_258 = local_398;
          local_250 = &local_2708;
          arma::Proxy<arma::Mat<double>_>::Proxy(&local_2708.P1,local_398);
          arma::Proxy<arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>_>::Proxy
                    (&local_2708.P2,local_260);
          uVar3 = (local_2708.P1.Q)->n_rows;
          uVar4 = (local_2708.P1.Q)->n_cols;
          local_1f0 = &local_2708.P2;
          uVar5 = (((local_2708.P2.Q)->P).Q)->n_rows;
          local_1d8 = &local_2708.P2;
          uVar6 = (((local_2708.P2.Q)->P).Q)->n_cols;
          local_248 = &local_2708;
          local_240 = &local_2708;
          local_208 = arma::eglue_minus::text();
          local_200 = uVar6;
          local_1fc = uVar5;
          local_1f8 = uVar4;
          local_1f4 = uVar3;
          if ((uVar3 != uVar5) || (uVar4 != uVar6)) {
            arma::arma_incompat_size_string_abi_cxx11_
                      ((uword)((ulong)in_stack_ffffffffffffd5e8 >> 0x20),
                       (uword)in_stack_ffffffffffffd5e8,
                       (uword)((ulong)in_stack_ffffffffffffd5e0 >> 0x20),
                       (uword)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5d8);
            arma::arma_stop_logic_error<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd430);
            std::__cxx11::string::~string(local_228);
          }
          local_3a8 = &local_26a8;
          local_3b0 = &local_26e8;
          local_3b8 = &local_2708;
          arma::
          Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>
          ::Glue(&local_26a8,local_3b0,local_3b8);
          local_3c0 = &local_2690;
          local_3c8 = &local_26a8;
          local_3d0 = &local_1438;
          arma::
          Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
          ::Glue(&local_2690,local_3c8,local_3d0);
          local_3d8 = &local_2678;
          local_3e0 = &local_2690;
          local_3e8 = local_eb0;
          arma::
          eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
          ::eOp((eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
                 *)in_stack_ffffffffffffd410,
                (Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                 *)in_stack_ffffffffffffd408.__d.__r,(elem_type)in_stack_ffffffffffffd400);
          local_450 = &local_2408;
          local_458 = &local_24e8;
          local_460 = &local_2678;
          local_1c0 = local_460;
          local_1b8 = local_458;
          local_1b0 = &local_2408;
          arma::
          Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
          ::Proxy(&local_2408,local_458);
          arma::
          Proxy<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>_>
          ::Proxy(&local_23f8,local_1c0);
          uVar3 = ((local_2408.Q)->P).Q.n_rows;
          uVar4 = ((local_2408.Q)->P).Q.n_cols;
          local_150 = &local_23f8;
          uVar5 = ((local_23f8.Q)->P).Q.n_rows;
          local_148 = &local_23f8;
          in_stack_ffffffffffffd4cc = ((local_23f8.Q)->P).Q.n_cols;
          local_160 = &local_2408;
          local_158 = &local_2408;
          local_178 = arma::eglue_plus::text();
          local_170 = in_stack_ffffffffffffd4cc;
          local_16c = uVar5;
          local_168 = uVar4;
          local_164 = uVar3;
          if ((uVar3 != uVar5) || (uVar4 != in_stack_ffffffffffffd4cc)) {
            arma::arma_incompat_size_string_abi_cxx11_
                      ((uword)((ulong)in_stack_ffffffffffffd5e8 >> 0x20),
                       (uword)in_stack_ffffffffffffd5e8,
                       (uword)((ulong)in_stack_ffffffffffffd5e0 >> 0x20),
                       (uword)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5d8);
            arma::arma_stop_logic_error<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd430);
            std::__cxx11::string::~string(local_198);
          }
          local_550 = &local_2760;
          local_558 = &local_1348;
          local_560 = &local_1fb8;
          arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::Glue
                    (&local_2760,local_558,local_560);
          in_stack_ffffffffffffd4b8 =
               (string *)
               arma::trace<arma::Mat<double>,arma::Mat<double>>
                         ((Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)
                          in_stack_ffffffffffffd488);
          local_468 = &local_23e8;
          local_470 = &local_2408;
          local_478 = in_stack_ffffffffffffd4b8;
          arma::
          eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>
          ::eOp((eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>
                 *)in_stack_ffffffffffffd410,
                (eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>
                 *)in_stack_ffffffffffffd408.__d.__r,(elem_type)in_stack_ffffffffffffd400);
          local_568 = &local_2778;
          local_570 = &local_1348;
          local_578 = &local_20d8;
          arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::Glue
                    (&local_2778,local_570,local_578);
          local_490 = arma::trace<arma::Mat<double>,arma::Mat<double>>
                                ((Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)
                                 in_stack_ffffffffffffd488);
          local_490 = -local_490;
          local_480 = &local_23a8;
          local_488 = &local_23e8;
          arma::
          eOp<arma::eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>,_arma::eop_scalar_plus>
          ::eOp((eOp<arma::eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>,_arma::eop_scalar_plus>
                 *)in_stack_ffffffffffffd410,
                (eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>
                 *)in_stack_ffffffffffffd408.__d.__r,(elem_type)in_stack_ffffffffffffd400);
          in_stack_ffffffffffffd488 = &local_23a8;
          local_36c = 0;
          local_ec = 0;
          local_dc = 0;
          local_bc = 0;
          local_a8 = ((local_23a8.P.Q)->P).Q;
          local_ac = 0;
          local_9c = 0;
          local_78 = (local_a8->P1).Q;
          local_7c = 0;
          local_5c = 0;
          local_4c = 0;
          in_stack_ffffffffffffd4a8 = (mat *)**(double **)((long)&(local_78->P).Q + 0x20);
          local_70 = local_78->aux;
          local_88 = &local_a8->P2;
          local_8c = 0;
          local_38 = local_88->Q;
          local_3c = 0;
          local_1c = 0;
          local_c = 0;
          local_28 = *(local_38->P).Q.mem;
          local_30 = local_38->aux;
          local_c8 = (double)in_stack_ffffffffffffd4a8 / local_70 + local_28 / local_30;
          local_d0 = (local_23a8.P.Q)->aux;
          local_f8 = local_c8 + local_d0;
          dVar10 = local_f8 + local_23a8.aux;
          local_368 = in_stack_ffffffffffffd488;
          local_e8 = in_stack_ffffffffffffd488;
          local_98 = local_a8;
          local_68 = in_stack_ffffffffffffd4a8;
          local_58 = local_78;
          local_48 = local_78;
          local_18 = local_38;
          local_8 = local_38;
          arma::
          eOp<arma::eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>,_arma::eop_scalar_plus>
          ::~eOp(&local_23a8);
          arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::~Glue(&local_2778);
          arma::
          eOp<arma::eGlue<arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>,_arma::eglue_plus>,_arma::eop_scalar_plus>
          ::~eOp(&local_23e8);
          arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::~Glue(&local_2760);
          local_360 = &local_2408;
          arma::
          eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
          ::~eOp((eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
                  *)0x18ee09);
          arma::
          Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
          ::~Glue(&local_2690);
          arma::
          Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>
          ::~Glue(&local_26a8);
          local_350 = &local_2708;
          arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>::~eOp(&local_2748);
          arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(&local_26e8);
          arma::
          eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
          ::~eOp((eOp<arma::Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>,_arma::eop_scalar_div_post>
                  *)0x18ee5a);
          arma::
          Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
          ::~Glue(&local_2500);
          arma::
          Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>::
          ~Glue(&local_2518);
          arma::Op<arma::Mat<double>,_arma::op_htrans2>::~Op(&local_2558);
          arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(&local_2598);
          local_2368 = dVar10;
          if ((*(byte *)(in_RDI + 0xaf0) & 1) != 0) {
            local_5b0 = local_10e8;
            local_5b4 = local_1b84;
            pdVar9 = arma::access::rw<double>((double *)(local_10c8 + (ulong)local_1b84 * 8));
            in_stack_ffffffffffffd438 = (mat *)*pdVar9;
            local_5c0 = local_10e8;
            local_5c4 = local_1e44;
            in_stack_ffffffffffffd440 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 arma::access::rw<double>((double *)(local_10c8 + (ulong)local_1e44 * 8));
            local_2368 = ((double)in_stack_ffffffffffffd438 * *(double *)in_stack_ffffffffffffd440)
                         / (double)local_ea8 + local_2368;
          }
          dVar10 = local_2368 / 2.0;
          local_808 = local_840;
          local_80c = local_1b84;
          local_810 = local_1e44;
          in_stack_ffffffffffffd430 =
               (mat *)arma::access::rw<double>
                                ((double *)
                                 (*(long *)(local_840 + 8) +
                                 (ulong)(local_1b84 + local_1e44 * *local_840) * 8));
          *(double *)in_stack_ffffffffffffd430 = dVar10;
          local_818 = local_840;
          local_81c = local_1e44;
          local_820 = local_1b84;
          pdVar9 = arma::access::rw<double>
                             ((double *)
                              (*(long *)(local_840 + 8) +
                              (ulong)(local_1e44 + local_1b84 * *local_840) * 8));
          *pdVar9 = dVar10;
          in_stack_ffffffffffffd410 = local_850;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd440,(char *)in_stack_ffffffffffffd438,
                     (allocator<char> *)in_stack_ffffffffffffd430);
          t0_11.__d.__r._4_4_ = in_stack_ffffffffffffd4cc;
          t0_11.__d.__r._0_4_ = in_stack_ffffffffffffd4c8;
          in_stack_ffffffffffffd408 =
               Bench::toc(in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4b8,t0_11);
          local_2780 = in_stack_ffffffffffffd408.__d.__r;
          local_1038 = in_stack_ffffffffffffd408.__d.__r;
          std::__cxx11::string::~string(local_27a0);
          std::allocator<char>::~allocator(&local_27a1);
          arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
          arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
          arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
          arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
          arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
        }
        arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
      }
      arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
    }
    arma::Col<double>::~Col((Col<double> *)0x18f44c);
    arma::Cube<double>::~Cube
              ((Cube<double> *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8));
    arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
    arma::Mat<double>::~Mat((Mat<double> *)in_stack_ffffffffffffd408.__d.__r);
    arma::Col<double>::~Col((Col<double> *)0x18f480);
  }
  KModel::~KModel(local_eb8);
  return (double)local_eb8;
}

Assistant:

double Kriging::_logLikelihood(const arma::vec& _theta,
                               arma::vec* grad_out,
                               arma::mat* hess_out,
                               Kriging::KModel* model,
                               std::map<std::string, double>* bench) const {
  // arma::cout << " theta: " << _theta << arma::endl;

  Kriging::KModel m = make_Model(_theta, bench);
  if (model != nullptr)
    *model = m;

  arma::uword n = m_X.n_rows;

  double sigma2;
  double ll;
  if (m_est_sigma2) {  // DiceKriging: model@case == "LLconcentration_beta_sigma2"
    sigma2 = m.SSEstar / n;
    ll = -0.5 * (n * log(2 * M_PI * sigma2) + 2 * arma::sum(log(m.L.diag())) + n);
  } else {  // DiceKriging: model@case == "LLconcentration_beta"
    sigma2 = m_sigma2;
    ll = -0.5
         * (n * log(2 * M_PI * sigma2) + 2 * arma::sum(log(m.L.diag()))
            + as_scalar(LinearAlgebra::crossprod(m.Estar)) / sigma2);
  }

  if (grad_out != nullptr) {
    arma::uword d = m_X.n_cols;
    arma::uword p = m_F.n_cols;

    auto t0 = Bench::tic();
    arma::vec terme1 = arma::vec(d);  // useful if (hess_out != nullptr)

    if ((m.Linv.memptr() == nullptr) || (arma::size(m.Linv) != arma::size(m.L))) {
      m.Linv = LinearAlgebra::solve(m.L, arma::mat(n, n, arma::fill::eye));
      t0 = Bench::toc(bench, "L ^-1", t0);
    }

    arma::mat Rinv = LinearAlgebra::crossprod(m.Linv);
    t0 = Bench::toc(bench, "R^-1 = t(L^-1) * L^-1", t0);

    arma::mat x = LinearAlgebra::solve(m.L.t(), m.Estar);
    t0 = Bench::toc(bench, "x = tL \\ z", t0);

    arma::cube gradR = arma::cube(n, n, d, arma::fill::none);
    const arma::vec zeros = arma::vec(d, arma::fill::zeros);
    for (arma::uword i = 0; i < n; i++) {
      gradR.tube(i, i) = zeros;
      for (arma::uword j = 0; j < i; j++) {
        gradR.tube(i, j) = m.R.at(i, j) * _DlnCovDtheta(m_dX.col(i * n + j), _theta);
        gradR.tube(j, i) = gradR.tube(i, j);
      }
    }
    t0 = Bench::toc(bench, "gradR = R * dlnCov(dX)", t0);

    for (arma::uword k = 0; k < d; k++) {
      t0 = Bench::tic();
      arma::mat gradR_k = gradR.slice(k);
      t0 = Bench::toc(bench, "gradR_k = gradR[k]", t0);

      // should make a fast function trace_prod(A,B) -> sum_i(sum_j(Ai,j*Bj,i))
      terme1.at(k) = as_scalar(x.t() * gradR_k * x) / sigma2;
      double terme2 = -arma::trace(Rinv * gradR_k);  //-arma::accu(Rinv % gradR_k_upper)
      (*grad_out).at(k) = (terme1.at(k) + terme2) / 2;
      t0 = Bench::toc(bench, "grad_ll[k] = xt * gradR_k / S2 + tr(Ri * gradR_k)", t0);

      if (hess_out != nullptr) {
        //' @ref O. Roustant
        // for (k in 1:d) {
        //   for (l in 1:k) {
        //     aux <- grad_R[[k]] %*% Rinv %*% grad_R[[l]]
        //     Dkl <- d2_matcor(X, modele_proba$covariance, R, grad_logR, k,l)
        //     xk <- backsolve(t(T),grad_R[[k]]%*%x, upper.tri=FALSE)
        //     xl <- backsolve(t(T),grad_R[[l]]%*%x, upper.tri=FALSE)
        //
        //     hess_A <- - (t(xk) %*% H %*% xl) / sigma2_hat
        //     hess_B <- (t(x) %*% ( -Dkl+2*aux ) %*% x) / sigma2_hat
        //     hess_C <- - grad_A[k] * grad_A[l] / n
        //     hess_D <- - sum(diag( Rinv %*% aux ))
        //     hess_E <- sum(diag( Rinv %*% Dkl ))
        //
        //     hess_log_vrais[k,l] <- 2*hess_A + hess_B + hess_C + hess_D + hess_E
        //     hess_log_vrais[l,k] <- hess_log_vrais[k,l]
        //   }
        // }
        t0 = Bench::tic();
        arma::mat H = LinearAlgebra::tcrossprod(m.Qstar);
        t0 = Bench::toc(bench, "H =  Q* * t(Q*)", t0);

        for (arma::uword l = 0; l <= k; l++) {
          arma::mat gradR_l = gradR.slice(l);  // arma::mat(n, n);

          t0 = Bench::tic();
          arma::mat aux = gradR_k * Rinv * gradR_l;
          t0 = Bench::toc(bench, "aux =  gradR[k] * Ri * gradR[l]", t0);

          arma::mat hessR_k_l = arma::mat(n, n, arma::fill::none);
          if (k == l) {
            for (arma::uword i = 0; i < n; i++) {
              hessR_k_l.at(i, i) = 0;
              for (arma::uword j = 0; j < i; j++) {
                double dln_k = gradR_k.at(i, j);
                hessR_k_l.at(i, j) = hessR_k_l.at(j, i)
                    = dln_k * (dln_k / m.R.at(i, j) - (_Cov_pow + 1) / _theta.at(k));
                // !! NO: it just work for exp type kernels. Matern MUST have a special treatment !!!
              }
            }
          } else {
            for (arma::uword i = 0; i < n; i++) {
              hessR_k_l.at(i, i) = 0;
              for (arma::uword j = 0; j < i; j++) {
                hessR_k_l.at(i, j) = hessR_k_l.at(j, i) = gradR_k.at(i, j) * gradR_l.at(i, j) / m.R.at(i, j);
                //= gradR.slice(i).col(j)[k] * gradR.slice(i).col(j)[l] / m.R.at(i, j);
              }
            }
          }
          t0 = Bench::toc(bench, "hessR_k_l = ...", t0);

          // arma::mat xk =LinearAlgebra::solve(m.T, gradsR[k] * x);
          arma::mat xk = m.Linv * gradR_k * x;
          t0 = Bench::toc(bench, "xk = L \\ gradR[k] * x", t0);
          arma::mat xl;
          if (k == l)
            xl = xk;
          else
            xl = m.Linv * gradR_l * x;
          t0 = Bench::toc(bench, "xl = L \\ gradR[l] * x", t0);

          // arma::cout << " hess_A:" << -xk.t() * H * xl / sigma2 << arma::endl;
          // arma::cout << " hess_B:" << -x.t() * (hessR_k_l - 2*aux) * x / sigma2 << arma::endl;
          // arma::cout << " hess_C:" << -terme1.at(k) * terme1.at(l) / n << arma::endl;
          // arma::cout << " hess_D:" << -arma::trace(Rinv * aux)  << arma::endl;
          // arma::cout << " hess_E:" << arma::trace(Rinv * hessR_k_l) << arma::endl;

          double h_lk
              = (2.0 * xk.t() * H * xl / (sigma2) + x.t() * (hessR_k_l - 2 * aux) * x / (sigma2)
                 + arma::trace(Rinv * aux) + -arma::trace(Rinv * hessR_k_l))[0];  // should optim there using accu  &%
          if (m_est_sigma2)
            h_lk += terme1.at(k) * terme1.at(l) / n;

          (*hess_out).at(l, k) = (*hess_out).at(k, l) = h_lk / 2;
          t0 = Bench::toc(bench, "hess_ll[l,k] = ...", t0);
        }
      }
    }
  }
  return ll;
}